

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

string * leveldb::EscapeString_abi_cxx11_(Slice *value)

{
  long lVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  string *r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_ffffffffffffffd0);
  AppendEscapedStringTo(in_stack_ffffffffffffffd8,(Slice *)in_stack_ffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string EscapeString(const Slice& value) {
  std::string r;
  AppendEscapedStringTo(&r, value);
  return r;
}